

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_CheckLimits(CMatchFinder *p)

{
  CMatchFinder *in_RDI;
  
  if (in_RDI->pos == 0xffffffff) {
    MatchFinder_Normalize(p);
  }
  if ((in_RDI->streamEndWasReached == '\0') &&
     (in_RDI->keepSizeAfter == in_RDI->streamPos - in_RDI->pos)) {
    MatchFinder_CheckAndMoveAndRead((CMatchFinder *)0x11fd64);
  }
  if (in_RDI->cyclicBufferPos == in_RDI->cyclicBufferSize) {
    in_RDI->cyclicBufferPos = 0;
  }
  MatchFinder_SetLimits(in_RDI);
  return;
}

Assistant:

static void MatchFinder_CheckLimits(CMatchFinder *p)
{
  if (p->pos == kMaxValForNormalize)
    MatchFinder_Normalize(p);
  if (!p->streamEndWasReached && p->keepSizeAfter == p->streamPos - p->pos)
    MatchFinder_CheckAndMoveAndRead(p);
  if (p->cyclicBufferPos == p->cyclicBufferSize)
    p->cyclicBufferPos = 0;
  MatchFinder_SetLimits(p);
}